

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvbios.c
# Opt level: O3

int usage(char *name)

{
  long lVar1;
  
  printf("\nUsage:\n %s [options] mybios.rom\n\n",name);
  puts("Options:");
  puts(" -h        print usage and exit");
  puts(" -m XX     set tCWL (for timing entry size < 20)");
  puts(" -s XX     set the trap register");
  puts(" -i XXXX   print init script at XXXX and exit");
  puts(" -v        be verbose");
  puts(" -u        print unused");
  puts(" -b        print blocks");
  printf(" -p XXXX   set print mask, XXXX can be: ");
  lVar1 = 0;
  do {
    printf("%s, ",*(undefined8 *)((long)&printmasks[0].name + lVar1));
    lVar1 = lVar1 + 0x10;
  } while (lVar1 != 0x1b0);
  puts(printmasks[0x1b].name);
  puts("\nFor more details see code");
  return 1;
}

Assistant:

int usage(char* name) {
	int i;

	printf("\nUsage:\n %s [options] mybios.rom\n\n", name);
	printf("Options:\n");
	printf(" -h        print usage and exit\n");
	printf(" -m XX     set tCWL (for timing entry size < 20)\n");
	printf(" -s XX     set the trap register\n");
	printf(" -i XXXX   print init script at XXXX and exit\n");
	printf(" -v        be verbose\n");
	printf(" -u        print unused\n");
	printf(" -b        print blocks\n");
	printf(" -p XXXX   set print mask, XXXX can be: ");
	for (i = 0; i < sizeof(printmasks) / sizeof(*printmasks) - 1; i++)
		printf("%s, ", printmasks[i].name);
	printf("%s\n", printmasks[i].name);

	printf("\nFor more details see code\n");
	return 1;
}